

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O3

void slang::ast::Lookup::name
               (NameSyntax *syntax,ASTContext *context,bitmask<slang::ast::LookupFlags> flags,
               LookupResult *result)

{
  SyntaxKind SVar1;
  GenericClassDefSymbol *this;
  Compilation *this_00;
  undefined1 auVar2 [16];
  optional<slang::SourceRange> sourceRange;
  optional<slang::SourceRange> range;
  optional<slang::SourceRange> range_00;
  string_view name;
  bool bVar3;
  KnownSystemName knownNameId;
  Type *pTVar4;
  SystemSubroutine *pSVar5;
  SourceLocation SVar6;
  Diagnostic *pDVar7;
  Scope *pSVar8;
  CompilationUnitSymbol *pCVar9;
  LookupResult *pLVar10;
  char *pcVar11;
  size_t sVar12;
  LookupResult *in_R9;
  LookupResult *result_00;
  string_view sVar13;
  SourceRange SVar14;
  span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL> selectors;
  string_view name_00;
  SourceRange range_01;
  LookupLocation location;
  Token tok;
  undefined4 uVar15;
  undefined4 uVar16;
  Token local_c8;
  NameComponents local_b8;
  _Storage<slang::SourceRange,_true> local_78;
  undefined1 local_68;
  undefined7 uStack_67;
  _Storage<slang::SourceRange,_true> local_60;
  undefined1 local_50;
  undefined7 uStack_4f;
  SourceLocation local_48;
  SourceLocation SStack_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  pSVar8 = (context->scope).ptr;
  local_b8.selectors._M_ptr = (pointer)0x0;
  local_b8.selectors._M_extent._M_extent_value = 0;
  local_b8.range.startLoc = (SourceLocation)0x0;
  local_b8.range.endLoc = (SourceLocation)0x0;
  local_b8.text._M_len = 0;
  local_b8.text._M_str = (char *)0x0;
  local_b8.paramAssignments = (ParameterValueAssignmentSyntax *)0x0;
  SVar1 = (syntax->super_ExpressionSyntax).super_SyntaxNode.kind;
  if ((int)SVar1 < 0x196) {
    if ((int)SVar1 < 0xe5) {
      if (SVar1 == ClassName) goto LAB_002d480b;
      SVar14 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      pDVar7 = Diagnostics::add(&result->diagnostics,pSVar8->thisSym,(DiagCode)0x35000a,SVar14);
      local_c8 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)syntax);
      sVar13 = parsing::Token::valueText(&local_c8);
      Diagnostic::operator<<(pDVar7,sVar13);
    }
    else if (SVar1 - IdentifierName < 2) {
LAB_002d480b:
      pLVar10 = result;
      anon_unknown_39::NameComponents::NameComponents(&local_b8,syntax);
      if (local_b8.text._M_len == 0) {
        return;
      }
      local_48 = local_b8.range.startLoc;
      SStack_40 = local_b8.range.endLoc;
      local_38 = 1;
      sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._17_7_ = uStack_37;
      sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_engaged = true;
      uVar15 = local_b8.range.startLoc._0_4_;
      uVar16 = local_b8.range.startLoc._4_4_;
      result_00 = (LookupResult *)(ulong)flags.m_bits;
      sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc =
           local_b8.range.endLoc;
      sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
           local_b8.range.startLoc;
      name_00._M_str = local_b8.text._M_str;
      name_00._M_len = local_b8.text._M_len;
      location.index = context->lookupIndex;
      location.scope = (Scope *)pLVar10;
      location._12_4_ = 0;
      unqualifiedImpl(pSVar8,name_00,location,sourceRange,flags,0,result,pSVar8,(SyntaxNode *)syntax
                     );
      if (result->found == (Symbol *)0x0) {
        if ((flags.m_bits >> 0xd & 1) != 0) {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = &local_b8;
          result_00 = result;
          bVar3 = anon_unknown_39::lookupUpward
                            ((anon_unknown_39 *)0x0,
                             (span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>
                              )(auVar2 << 0x40),(NameComponents *)context,
                             (ASTContext *)(ulong)flags.m_bits,
                             (bitmask<slang::ast::LookupFlags>)(underlying_type)result,
                             (LookupResult *)CONCAT44(uVar16,uVar15));
          if (!bVar3) {
            return;
          }
          if (result->found != (Symbol *)0x0) goto LAB_002d488b;
        }
        bVar3 = LookupResult::hasError(result);
        if (!bVar3) {
          name._M_str = local_b8.text._M_str;
          name._M_len = local_b8.text._M_len;
          SVar14.endLoc = local_b8.range.endLoc;
          SVar14.startLoc = local_b8.range.startLoc;
          result_00 = (LookupResult *)(ulong)flags.m_bits;
          reportUndeclared(pSVar8,name,SVar14,flags,false,result);
        }
      }
LAB_002d488b:
      this = (GenericClassDefSymbol *)result->found;
      if (local_b8.paramAssignments != (ParameterValueAssignmentSyntax *)0x0 &&
          this != (GenericClassDefSymbol *)0x0) {
        if ((this->super_Symbol).kind == GenericClassDef) {
          pTVar4 = GenericClassDefSymbol::getSpecialization(this,context,local_b8.paramAssignments);
        }
        else {
          SVar14 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
          pDVar7 = Diagnostics::add(&result->diagnostics,pSVar8->thisSym,(DiagCode)0x1f000a,SVar14);
          Diagnostic::operator<<(pDVar7,result->found->name);
          Diagnostic::addNote(pDVar7,(DiagCode)0x50001,result->found->location);
          pTVar4 = (Type *)0x0;
        }
        result->found = &pTVar4->super_Symbol;
      }
      local_78._M_value = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      local_68 = 1;
      range_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._17_7_ = uStack_67;
      range_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_engaged = true;
      range_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value = local_78._M_value;
      anon_unknown_39::unwrapResult(pSVar8,range_00,result,true);
      if ((pointer)local_b8.selectors._M_extent._M_extent_value == (pointer)0x0) {
        return;
      }
      if (((result->found == (Symbol *)0x0) ||
          (pSVar8 = Symbol::scopeOrNull(result->found), pSVar8 == (Scope *)0x0)) ||
         (bVar3 = Symbol::isType(result->found), bVar3)) {
        SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
        ::
        append<__gnu_cxx::__normal_iterator<const_slang::syntax::ElementSelectSyntax_*const_*,_std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>_>_>
                  (&(result->selectors).
                    super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                   ,(__normal_iterator<const_slang::syntax::ElementSelectSyntax_*const_*,_std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>_>
                     )local_b8.selectors._M_ptr,
                   (__normal_iterator<const_slang::syntax::ElementSelectSyntax_*const_*,_std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>_>
                    )(local_b8.selectors._M_ptr + local_b8.selectors._M_extent._M_extent_value));
        if (-1 < (char)flags.m_bits) {
          return;
        }
        LookupResult::errorIfSelectors(result,context);
        return;
      }
      selectors._M_extent._M_extent_value = (size_t)context;
      selectors._M_ptr = (pointer)local_b8.selectors._M_extent._M_extent_value;
      pCVar9 = (CompilationUnitSymbol *)
               selectChild((Lookup *)result->found,(Symbol *)local_b8.selectors._M_ptr,selectors,
                           (ASTContext *)result,result_00);
      goto LAB_002d4bf0;
    }
    result->found = (Symbol *)0x0;
  }
  else {
    if ((int)SVar1 < 0x1c7) {
      if (SVar1 != RootScope) {
        qualified((ScopedNameSyntax *)syntax,context,flags,result);
        local_60._M_value = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
        local_50 = 1;
        range.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::SourceRange>._17_7_ = uStack_4f;
        range.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::SourceRange>._M_engaged = true;
        range.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::SourceRange>._M_payload._M_value = local_60._M_value;
        anon_unknown_39::unwrapResult(pSVar8,range,result,true);
        if (-1 < (char)flags.m_bits) {
          return;
        }
        LookupResult::errorIfSelectors(result,context);
        return;
      }
      if ((flags.m_bits >> 8 & 1) == 0) {
        local_c8 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)syntax);
        SVar6 = parsing::Token::location(&local_c8);
        sVar13 = parsing::Token::valueText(&local_c8);
        pDVar7 = Diagnostics::add(&result->diagnostics,pSVar8->thisSym,(DiagCode)0x550005,
                                  (SourceLocation)((long)SVar6 + sVar13._M_len * 0x10000000));
        pcVar11 = ".";
        sVar12 = 1;
LAB_002d49c5:
        sVar13._M_str = pcVar11;
        sVar13._M_len = sVar12;
LAB_002d4c56:
        Diagnostic::operator<<(pDVar7,sVar13);
        return;
      }
      pCVar9 = (CompilationUnitSymbol *)Compilation::getRoot(pSVar8->compilation);
    }
    else {
      if (SVar1 == SystemName) {
        local_c8 = *(Token *)(syntax + 1);
        result->found = (Symbol *)0x0;
        knownNameId = parsing::Token::systemName(&local_c8);
        this_00 = pSVar8->compilation;
        if (knownNameId == Unknown) {
          sVar13 = parsing::Token::valueText(&local_c8);
          pSVar5 = Compilation::getSystemSubroutine(this_00,sVar13);
        }
        else {
          pSVar5 = Compilation::getSystemSubroutine(this_00,knownNameId);
        }
        result->systemSubroutine = pSVar5;
        if (pSVar5 != (SystemSubroutine *)0x0) {
          return;
        }
        SVar14 = parsing::Token::range(&local_c8);
        pDVar7 = Diagnostics::add(&result->diagnostics,pSVar8->thisSym,(DiagCode)0x42000a,SVar14);
        sVar13 = parsing::Token::valueText(&local_c8);
        goto LAB_002d4c56;
      }
      if (SVar1 == ThisHandle) {
        SVar14 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
        range_01.endLoc = (SourceLocation)result;
        range_01.startLoc = SVar14.endLoc;
        pCVar9 = (CompilationUnitSymbol *)
                 anon_unknown_39::findThisHandle
                           ((anon_unknown_39 *)pSVar8->thisSym,(Scope *)(ulong)flags.m_bits,
                            (bitmask<slang::ast::LookupFlags>)SVar14.startLoc._0_4_,range_01,in_R9);
      }
      else {
        if ((flags.m_bits >> 9 & 1) == 0) {
          local_c8 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)syntax);
          SVar6 = parsing::Token::location(&local_c8);
          sVar13 = parsing::Token::valueText(&local_c8);
          pDVar7 = Diagnostics::add(&result->diagnostics,pSVar8->thisSym,(DiagCode)0x550005,
                                    (SourceLocation)((long)SVar6 + sVar13._M_len * 0x10000000));
          pcVar11 = "::";
          sVar12 = 2;
          goto LAB_002d49c5;
        }
        pCVar9 = Scope::getCompilationUnit(pSVar8);
      }
    }
LAB_002d4bf0:
    result->found = &pCVar9->super_Symbol;
  }
  return;
}

Assistant:

void Lookup::name(const NameSyntax& syntax, const ASTContext& context, bitmask<LookupFlags> flags,
                  LookupResult& result) {
    auto& scope = *context.scope;
    NameComponents name;
    switch (syntax.kind) {
        case SyntaxKind::IdentifierName:
        case SyntaxKind::IdentifierSelectName:
        case SyntaxKind::ClassName:
            name = syntax;
            break;
        case SyntaxKind::ScopedName:
            // Handle qualified names separately.
            qualified(syntax.as<ScopedNameSyntax>(), context, flags, result);
            unwrapResult(scope, syntax.sourceRange(), result);
            if (flags.has(LookupFlags::NoSelectors))
                result.errorIfSelectors(context);
            return;
        case SyntaxKind::ThisHandle:
            result.found = findThisHandle(scope, flags, syntax.sourceRange(), result);
            return;
        case SyntaxKind::SystemName: {
            // If this is a system name, look up directly in the compilation.
            Token nameToken = syntax.as<SystemNameSyntax>().systemIdentifier;
            result.found = nullptr;

            if (auto knownNameId = nameToken.systemName();
                knownNameId != KnownSystemName::Unknown) {
                result.systemSubroutine = scope.getCompilation().getSystemSubroutine(knownNameId);
            }
            else {
                result.systemSubroutine = scope.getCompilation().getSystemSubroutine(
                    nameToken.valueText());
            }

            if (!result.systemSubroutine) {
                result.addDiag(scope, diag::UnknownSystemName, nameToken.range())
                    << nameToken.valueText();
            }
            return;
        }
        case SyntaxKind::RootScope:
            if (!flags.has(LookupFlags::AllowRoot)) {
                auto tok = syntax.getFirstToken();
                result.addDiag(scope, diag::ExpectedToken,
                               tok.location() + tok.valueText().length())
                    << "."sv;
                return;
            }
            result.found = &scope.getCompilation().getRoot();
            return;
        case SyntaxKind::UnitScope:
            if (!flags.has(LookupFlags::AllowUnit)) {
                auto tok = syntax.getFirstToken();
                result.addDiag(scope, diag::ExpectedToken,
                               tok.location() + tok.valueText().length())
                    << "::"sv;
                return;
            }
            result.found = scope.getCompilationUnit();
            return;
        case SyntaxKind::ConstructorName:
            result.addDiag(scope, diag::UnexpectedNameToken, syntax.sourceRange())
                << syntax.getFirstToken().valueText();
            result.found = nullptr;
            return;
        case SyntaxKind::LocalScope:
            // This can only happen in error scenarios, where the parser has
            // already issued a diagnostic.
            result.found = nullptr;
            return;
        case SyntaxKind::SuperHandle:
        case SyntaxKind::ArrayUniqueMethod:
        case SyntaxKind::ArrayAndMethod:
        case SyntaxKind::ArrayOrMethod:
        case SyntaxKind::ArrayXorMethod:
            // These error cases can't happen here because the parser will always
            // wrap them into a scoped name.
        default:
            SLANG_UNREACHABLE;
    }

    // If the parser added a missing identifier token, it already issued an appropriate error.
    if (name.text.empty())
        return;

    // Perform the lookup.
    unqualifiedImpl(scope, name.text, context.getLocation(), name.range, flags, {}, result, scope,
                    &syntax);

    if (!result.found) {
        if (flags.has(LookupFlags::AlwaysAllowUpward)) {
            if (!lookupUpward({}, name, context, flags, result))
                return;
        }

        if (!result.found && !result.hasError())
            reportUndeclared(scope, name.text, name.range, flags, false, result);
    }

    if (result.found && name.paramAssignments) {
        if (result.found->kind != SymbolKind::GenericClassDef) {
            auto& diag = result.addDiag(scope, diag::NotAGenericClass, syntax.sourceRange());
            diag << result.found->name;
            diag.addNote(diag::NoteDeclarationHere, result.found->location);

            result.found = nullptr;
        }
        else {
            auto& classDef = result.found->as<GenericClassDefSymbol>();
            result.found = &classDef.getSpecialization(context, *name.paramAssignments);
        }
    }

    unwrapResult(scope, syntax.sourceRange(), result);

    if (!name.selectors.empty()) {
        // If this is a scope, the selectors should be an index into it.
        if (result.found && result.found->isScope() && !result.found->isType()) {
            result.found = selectChild(*result.found, name.selectors, context, result);
        }
        else {
            result.selectors.append_range(name.selectors);
            if (flags.has(LookupFlags::NoSelectors))
                result.errorIfSelectors(context);
        }
    }
}